

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

ExtractResult absl::lts_20250127::ExtractAppendBuffer(Nonnull<CordRep_*> rep,size_t min_capacity)

{
  undefined1 auVar1 [16];
  bool bVar2;
  CordRepBtree *tree;
  CordRepFlat *this;
  size_t sVar3;
  size_t min_capacity_local;
  Nonnull<CordRep_*> rep_local;
  CordRep *local_10;
  
  if (rep->tag == '\x03') {
    tree = cord_internal::CordRep::btree(rep);
    _rep_local = cord_internal::CordRepBtree::ExtractAppendBuffer(tree,min_capacity);
  }
  else {
    bVar2 = cord_internal::CordRep::IsFlat(rep);
    if ((bVar2) && (bVar2 = cord_internal::RefcountAndFlags::IsOne(&rep->refcount), bVar2)) {
      this = cord_internal::CordRep::flat(rep);
      sVar3 = cord_internal::CordRepFlat::Capacity(this);
      if (min_capacity <= sVar3 - rep->length) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = rep;
        _rep_local = (ExtractResult)(auVar1 << 0x40);
        return _rep_local;
      }
    }
    local_10 = (CordRep *)0x0;
    rep_local = rep;
  }
  return _rep_local;
}

Assistant:

static CordRep::ExtractResult ExtractAppendBuffer(absl::Nonnull<CordRep*> rep,
                                                  size_t min_capacity) {
  switch (rep->tag) {
    case cord_internal::BTREE:
      return CordRepBtree::ExtractAppendBuffer(rep->btree(), min_capacity);
    default:
      if (rep->IsFlat() && rep->refcount.IsOne() &&
          rep->flat()->Capacity() - rep->length >= min_capacity) {
        return {nullptr, rep};
      }
      return {rep, nullptr};
  }
}